

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rate_adaptive_code.cpp
# Opt level: O2

void __thiscall
rate_adaptive_code_from_colptr_rowIdx_encode_current_rate_Test::
~rate_adaptive_code_from_colptr_rowIdx_encode_current_rate_Test
          (rate_adaptive_code_from_colptr_rowIdx_encode_current_rate_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(rate_adaptive_code_from_colptr_rowIdx, encode_current_rate) {
    auto H = get_code_big_wra();
    std::vector<Bit> in = get_bitstring(H.getNCols());
    std::vector<Bit> out(H.get_n_rows_mother_matrix());

    H.encode_at_current_rate(in, out);

    EXPECT_EQ(hash_vector(out), 2814594723);

    const auto n_line_combs = static_cast<std::size_t>(static_cast<double>(H.get_n_rows_mother_matrix()) * 0.3);
    H.set_rate(n_line_combs);

    H.encode_at_current_rate(in, out);
    EXPECT_EQ(hash_vector(out), 0x6a8bf1e0);
}